

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

JitProfilingInstr *
IR::JitProfilingInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  JitProfilingInstr *this;
  
  bVar2 = Func::DoSimpleJitDynamicProfile(func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x307,"(func->DoSimpleJitDynamicProfile())",
                       "func->DoSimpleJitDynamicProfile()");
    if (!bVar2) goto LAB_004b4058;
    *puVar4 = 0;
  }
  this = (JitProfilingInstr *)new<Memory::JitArenaAllocator>(0x68,func->m_alloc,0x3eba5c);
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  (this->super_Instr).m_opcode = EndOfBlock;
  (this->super_Instr).ignoreOverflowBitCount = '\0';
  (this->super_Instr).dataWidth = '\0';
  (this->super_Instr).highlight = 0;
  *(undefined2 *)&(this->super_Instr).field_0x36 = 0;
  *(undefined8 *)&(this->super_Instr).field_0x38 = 0;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr).m_noLazyHelperAssert = false;
  *(undefined3 *)&(this->super_Instr).field_0x9 = 0;
  (this->super_Instr).bailOutByteCodeLocation = 0;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  this->profileId = 0;
  this->arrayProfileId = 0;
  this->field_2 = (anon_union_4_2_bef1c525_for_JitProfilingInstr_3)0x0;
  *(undefined8 *)&this->field_0x60 = 0;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  *(undefined2 *)&(this->super_Instr).field_0x36 = 0;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014d56f0;
  Instr::Init((Instr *)this,opcode,InstrKindJitProfiling,func);
  if (dstOpnd != (Opnd *)0x0) {
    Instr::SetDst((Instr *)this,dstOpnd);
  }
  if (src1Opnd != (Opnd *)0x0) {
    if ((this->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar2) goto LAB_004b4058;
      *puVar4 = 0;
    }
    func_00 = (this->super_Instr).m_func;
    if (src1Opnd->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar2) {
LAB_004b4058:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar3 = src1Opnd->field_0xb;
    if ((bVar3 & 2) != 0) {
      src1Opnd = Opnd::Copy(src1Opnd,func_00);
      bVar3 = src1Opnd->field_0xb;
    }
    src1Opnd->field_0xb = bVar3 | 2;
    (this->super_Instr).m_src1 = src1Opnd;
  }
  this->profileId = 0xffff;
  this->arrayProfileId = 0xffff;
  this->field_2 = (anon_union_4_2_bef1c525_for_JitProfilingInstr_3)0xffffffff;
  this->field_0x60 = this->field_0x60 & 0xf0;
  return this;
}

Assistant:

JitProfilingInstr *
JitProfilingInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    Assert(func->DoSimpleJitDynamicProfile());

    JitProfilingInstr * profiledInstr = JitAnew(func->m_alloc, IR::JitProfilingInstr);
    profiledInstr->Init(opcode, InstrKindJitProfiling, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

#if DBG
    profiledInstr->profileId = Js::Constants::NoProfileId;
    profiledInstr->arrayProfileId = Js::Constants::NoProfileId;
    profiledInstr->inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    Assert(profiledInstr->loopNumber == 0u - 1);
#endif

    // default these to false.
    profiledInstr->isProfiledReturnCall = false;
    profiledInstr->isBeginSwitch = false;
    profiledInstr->isNewArray = false;
    profiledInstr->isLoopHelper = false;

    return profiledInstr;
}